

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O2

void __thiscall
S2Builder::Graph::MakeSiblingMap(Graph *this,vector<int,_std::allocator<int>_> *in_edge_ids)

{
  int iVar1;
  EdgeType EVar2;
  int iVar3;
  pointer ppVar4;
  pointer piVar5;
  pointer ppVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  S2LogMessage SStack_18;
  
  EVar2 = (this->options_).edge_type_;
  if ((this->options_).sibling_pairs_ + ~CREATE < 0xfffffffe && EVar2 != UNDIRECTED) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
               ,0x51,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,
                    "Check failed: options_.sibling_pairs() == SiblingPairs::REQUIRE || options_.sibling_pairs() == SiblingPairs::CREATE || options_.edge_type() == EdgeType::UNDIRECTED "
                   );
  }
  else {
    ppVar4 = (this->edges_->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start;
    uVar8 = (ulong)((long)(this->edges_->
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4) >> 3;
    iVar7 = (int)uVar8;
    uVar11 = 0;
    uVar10 = 0;
    if (0 < iVar7) {
      uVar11 = uVar8 & 0xffffffff;
    }
    do {
      if (uVar11 == uVar10) {
        if (EVar2 == DIRECTED) {
          return;
        }
        if ((this->options_).degenerate_edges_ == DISCARD) {
          return;
        }
        iVar9 = 0;
        goto LAB_00206079;
      }
      iVar9 = (in_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar10];
    } while ((ppVar4[uVar10].first == ppVar4[iVar9].second) &&
            (ppVar6 = ppVar4 + uVar10, uVar10 = uVar10 + 1, ppVar6->second == ppVar4[iVar9].first));
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
               ,0x53,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,"Check failed: edge(e) == reverse(edge((*in_edge_ids)[e])) ");
  }
LAB_00206068:
  abort();
LAB_00206079:
  if (iVar7 <= iVar9) {
    return;
  }
  iVar3 = ppVar4[iVar9].first;
  if (ppVar4[iVar9].second == iVar3) {
    iVar1 = iVar9 + 1;
    if (iVar7 <= iVar1) {
      S2LogMessage::S2LogMessage
                (&SStack_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                 ,0x5b,kFatal,(ostream *)&std::cerr);
      std::operator<<(SStack_18.stream_,"Check failed: (e + 1) < (num_edges()) ");
      goto LAB_00206068;
    }
    if (ppVar4[iVar1].first != iVar3) {
      S2LogMessage::S2LogMessage
                (&SStack_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                 ,0x5c,kFatal,(ostream *)&std::cerr);
      std::operator<<(SStack_18.stream_,"Check failed: (edge(e + 1).first) == (v) ");
      goto LAB_00206068;
    }
    if (ppVar4[iVar1].second != iVar3) {
      S2LogMessage::S2LogMessage
                (&SStack_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                 ,0x5d,kFatal,(ostream *)&std::cerr);
      std::operator<<(SStack_18.stream_,"Check failed: (edge(e + 1).second) == (v) ");
      goto LAB_00206068;
    }
    piVar5 = (in_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar5[iVar9] != iVar9) {
      S2LogMessage::S2LogMessage
                (&SStack_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                 ,0x5e,kFatal,(ostream *)&std::cerr);
      std::operator<<(SStack_18.stream_,"Check failed: ((*in_edge_ids)[e]) == (e) ");
      goto LAB_00206068;
    }
    if (piVar5[iVar1] != iVar1) {
      S2LogMessage::S2LogMessage
                (&SStack_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder_graph.cc"
                 ,0x5f,kFatal,(ostream *)&std::cerr);
      std::operator<<(SStack_18.stream_,"Check failed: ((*in_edge_ids)[e + 1]) == (e + 1) ");
      goto LAB_00206068;
    }
    piVar5[iVar9] = iVar1;
    piVar5[iVar1] = iVar9;
    iVar9 = iVar1;
  }
  iVar9 = iVar9 + 1;
  goto LAB_00206079;
}

Assistant:

void Graph::MakeSiblingMap(vector<Graph::EdgeId>* in_edge_ids) const {
  S2_DCHECK(options_.sibling_pairs() == SiblingPairs::REQUIRE ||
         options_.sibling_pairs() == SiblingPairs::CREATE ||
         options_.edge_type() == EdgeType::UNDIRECTED);
  for (EdgeId e = 0; e < num_edges(); ++e) {
    S2_DCHECK(edge(e) == reverse(edge((*in_edge_ids)[e])));
  }
  if (options_.edge_type() == EdgeType::DIRECTED) return;
  if (options_.degenerate_edges() == DegenerateEdges::DISCARD) return;

  for (EdgeId e = 0; e < num_edges(); ++e) {
    VertexId v = edge(e).first;
    if (edge(e).second == v) {
      S2_DCHECK_LT(e + 1, num_edges());
      S2_DCHECK_EQ(edge(e + 1).first, v);
      S2_DCHECK_EQ(edge(e + 1).second, v);
      S2_DCHECK_EQ((*in_edge_ids)[e], e);
      S2_DCHECK_EQ((*in_edge_ids)[e + 1], e + 1);
      (*in_edge_ids)[e] = e + 1;
      (*in_edge_ids)[e + 1] = e;
      ++e;
    }
  }
}